

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void emit_class_field_init(JSParseState *s)

{
  int label;
  undefined2 local_2e;
  uint8_t local_2c [12];
  
  emit_op(s,0xb6);
  local_2c[4] = 'v';
  local_2c[5] = '\0';
  local_2c[6] = '\0';
  local_2c[7] = '\0';
  dbuf_put(&s->cur_func->byte_code,local_2c + 4,4);
  local_2e = (undefined2)s->cur_func->scope_level;
  dbuf_put(&s->cur_func->byte_code,(uint8_t *)&local_2e,2);
  emit_op(s,'\x11');
  label = emit_goto(s,0x69,-1);
  emit_op(s,0xb6);
  local_2c[8] = '\b';
  local_2c[9] = '\0';
  local_2c[10] = '\0';
  local_2c[0xb] = '\0';
  dbuf_put(&s->cur_func->byte_code,local_2c + 8,4);
  local_2c[0] = '\0';
  local_2c[1] = '\0';
  dbuf_put(&s->cur_func->byte_code,local_2c,2);
  emit_op(s,'\x1b');
  emit_op(s,'$');
  local_2c[2] = '\0';
  local_2c[3] = '\0';
  dbuf_put(&s->cur_func->byte_code,local_2c + 2,2);
  emit_label(s,label);
  emit_op(s,'\x0e');
  return;
}

Assistant:

static void emit_class_field_init(JSParseState *s)
{
    int label_next;
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_class_fields_init);
    emit_u16(s, s->cur_func->scope_level);

    /* no need to call the class field initializer if not defined */
    emit_op(s, OP_dup);
    label_next = emit_goto(s, OP_if_false, -1);
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_this);
    emit_u16(s, 0);
    
    emit_op(s, OP_swap);
    
    emit_op(s, OP_call_method);
    emit_u16(s, 0);

    emit_label(s, label_next);
    emit_op(s, OP_drop);
}